

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.h
# Opt level: O1

void __thiscall flow::lang::BuiltinHandlerSym::~BuiltinHandlerSym(BuiltinHandlerSym *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pLVar2;
  pointer pcVar3;
  
  (this->super_CallableSym).super_Symbol.super_ASTNode._vptr_ASTNode =
       (_func_int **)&PTR__CallableSym_00194958;
  pLVar2 = (this->super_CallableSym).sig_.args_.
           super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pLVar2 != (pointer)0x0) {
    operator_delete(pLVar2,(long)(this->super_CallableSym).sig_.args_.
                                 super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pLVar2);
  }
  pcVar3 = (this->super_CallableSym).sig_.name_._M_dataplus._M_p;
  paVar1 = &(this->super_CallableSym).sig_.name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_CallableSym).super_Symbol.super_ASTNode._vptr_ASTNode =
       (_func_int **)&PTR__Symbol_00194788;
  pcVar3 = (this->super_CallableSym).super_Symbol.name_._M_dataplus._M_p;
  paVar1 = &(this->super_CallableSym).super_Symbol.name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_CallableSym).super_Symbol.super_ASTNode._vptr_ASTNode =
       (_func_int **)&PTR__ASTNode_001947b0;
  pcVar3 = (this->super_CallableSym).super_Symbol.super_ASTNode.location_.filename._M_dataplus._M_p;
  paVar1 = &(this->super_CallableSym).super_Symbol.super_ASTNode.location_.filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0xb8);
  return;
}

Assistant:

explicit BuiltinHandlerSym(const NativeCallback& cb)
      : CallableSym(Symbol::BuiltinHandler, &cb, SourceLocation()) {}